

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmError pm_add_device(char *interf,char *name,int input,void *descriptor,pm_fns_type dictionary)

{
  descriptor_type paVar1;
  long lVar2;
  
  if (pm_descriptor_max <= pm_descriptor_index) {
    paVar1 = (descriptor_type)pm_alloc((long)pm_descriptor_max * 0x40 + 0x800);
    if (paVar1 == (descriptor_type)0x0) {
      return pmInsufficientMemory;
    }
    if (descriptors != (descriptor_type)0x0) {
      memcpy(paVar1,descriptors,(long)pm_descriptor_max << 6);
      free(descriptors);
    }
    pm_descriptor_max = pm_descriptor_max + 0x20;
    descriptors = paVar1;
  }
  lVar2 = (long)pm_descriptor_index;
  descriptors[lVar2].pub.interf = interf;
  descriptors[lVar2].pub.name = name;
  paVar1 = descriptors;
  descriptors[lVar2].pub.input = input;
  paVar1[pm_descriptor_index].pub.output = (uint)(input == 0);
  paVar1[pm_descriptor_index].pub.opened = 0;
  lVar2 = (long)pm_descriptor_index;
  paVar1[lVar2].descriptor = descriptor;
  descriptors[lVar2].internalDescriptor = (void *)0x0;
  descriptors[lVar2].dictionary = dictionary;
  pm_descriptor_index = pm_descriptor_index + 1;
  return pmNoData;
}

Assistant:

PmError pm_add_device(char *interf, char *name, int input, 
                      void *descriptor, pm_fns_type dictionary) {
    if (pm_descriptor_index >= pm_descriptor_max) {
        // expand descriptors
        descriptor_type new_descriptors = (descriptor_type) 
            pm_alloc(sizeof(descriptor_node) * (pm_descriptor_max + 32));
        if (!new_descriptors) return pmInsufficientMemory;
        if (descriptors) {
            memcpy(new_descriptors, descriptors, 
                   sizeof(descriptor_node) * pm_descriptor_max);
            free(descriptors);
        }
        pm_descriptor_max += 32;
        descriptors = new_descriptors;
    }
    descriptors[pm_descriptor_index].pub.interf = interf;
    descriptors[pm_descriptor_index].pub.name = name;
    descriptors[pm_descriptor_index].pub.input = input;
    descriptors[pm_descriptor_index].pub.output = !input;

    /* default state: nothing to close (for automatic device closing) */
    descriptors[pm_descriptor_index].pub.opened = FALSE;

    /* ID number passed to win32 multimedia API open */
    descriptors[pm_descriptor_index].descriptor = descriptor;
    
    /* points to PmInternal, allows automatic device closing */
    descriptors[pm_descriptor_index].internalDescriptor = NULL;

    descriptors[pm_descriptor_index].dictionary = dictionary;
    
    pm_descriptor_index++;
    
    return pmNoError;
}